

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_geometry_device.cpp
# Opt level: O0

void embree::instanceOccludedFuncN(RTCOccludedFunctionNArguments *args)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *in_RDI;
  RTCOccludedArguments sargs;
  Ray *ray;
  LazyGeometry *instance;
  RTCRayHitN *rays;
  RTCRayQueryContext *context;
  void *ptr;
  int *valid;
  undefined4 local_68;
  undefined4 local_64;
  LazyGeometry *in_stack_ffffffffffffffa0;
  
  lVar1 = in_RDI[1];
  uVar2 = in_RDI[4];
  if (*(int *)*in_RDI != 0) {
    if (*(int *)(lVar1 + 8) != 3) {
      lazyCreate(in_stack_ffffffffffffffa0);
    }
    local_68 = 0;
    local_64 = 0xffffffff;
    rtcOccluded1(*(undefined8 *)(lVar1 + 0x10),uVar2,&local_68);
  }
  return;
}

Assistant:

void instanceOccludedFuncN(const RTCOccludedFunctionNArguments* args)
{
  const int* valid = args->valid;
  void* ptr  = args->geometryUserPtr;
  RTCRayQueryContext* context = args->context;
  RTCRayHitN* rays = (RTCRayHitN*)args->ray;
  assert(args->N == 1);
  LazyGeometry* instance = (LazyGeometry*)ptr;

  if (!valid[0])
    return;
  
  Ray *ray = (Ray *)rays;
  /* create the object if it is not yet created */
  if (instance->state != LAZY_VALID)
    lazyCreate(instance);
  
  /* trace ray inside object */
  RTCOccludedArguments sargs;
  rtcInitOccludedArguments(&sargs);
  sargs.context = context;
  rtcOccluded1(instance->object,RTCRay_(*ray),&sargs);
}